

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

RunStats __thiscall soul::ResolutionPass::run(ResolutionPass *this,bool ignoreTypeAndConstantErrors)

{
  ModuleBase *pMVar1;
  Allocator *a;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  long extraout_RDX;
  undefined7 in_register_00000031;
  ulong i;
  RunStats RVar4;
  RunStats local_c8;
  undefined4 local_ac;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_a8;
  ResolutionPass local_98;
  
  pMVar1 = this->module;
  if (pMVar1->isFullyResolved == false) {
    if ((pMVar1->specialisationParams).
        super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pMVar1->specialisationParams).
        super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_ac = (undefined4)CONCAT71(in_register_00000031,ignoreTypeAndConstantErrors);
      do {
        local_c8.numFailures = 0;
        local_c8.numReplaced = 0;
        tryPass<soul::ResolutionPass::QualifiedIdentifierResolver>(this,&local_c8,true);
        tryPass<soul::ResolutionPass::TypeResolver>(this,&local_c8,true);
        tryPass<soul::ResolutionPass::ProcessorInstanceResolver>(this,&local_c8,true);
        tryPass<soul::ResolutionPass::NamespaceAliasResolver>(this,&local_c8,true);
        tryPass<soul::ResolutionPass::OperatorResolver>(this,&local_c8,true);
        rebuildVariableUseCounts(this->module);
        tryPass<soul::ResolutionPass::FunctionResolver>(this,&local_c8,true);
        tryPass<soul::ResolutionPass::ConstantFolder>(this,&local_c8,true);
        rebuildVariableUseCounts(this->module);
        if (local_c8.numReplaced == 0) {
          tryPass<soul::ResolutionPass::GenericFunctionResolver>(this,&local_c8,true);
        }
        i = 0;
        while( true ) {
          iVar2 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
          if ((ulong)(extraout_RDX - CONCAT44(extraout_var,iVar2) >> 3) <= i) break;
          a = this->allocator;
          iVar2 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
          local_a8.s = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var_00,iVar2);
          ppVar3 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[](&local_a8,i);
          ResolutionPass(&local_98,a,ppVar3->object);
          RVar4 = run(&local_98,ignoreTypeAndConstantErrors);
          local_c8.numFailures = local_c8.numFailures + RVar4.numFailures;
          local_c8.numReplaced = local_c8.numReplaced + RVar4.numReplaced;
          ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                    (&local_98.intrinsicsNamespacePath.pathSections);
          i = i + 1;
        }
        if (local_c8.numFailures == 0) goto LAB_0023d5e9;
      } while (local_c8.numReplaced != 0);
      if ((char)local_ac == '\0') {
        tryPass<soul::ResolutionPass::FunctionResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::QualifiedIdentifierResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::TypeResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::ProcessorInstanceResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::NamespaceAliasResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::OperatorResolver>(this,&local_c8,false);
        tryPass<soul::ResolutionPass::GenericFunctionResolver>(this,&local_c8,false);
LAB_0023d5e9:
        SanityCheckPass::runPostResolutionChecks(this->module);
        this->module->isFullyResolved = true;
      }
      else {
        local_c8.numReplaced = 0;
      }
      goto LAB_0023d42d;
    }
    pMVar1->isFullyResolved = true;
  }
  local_c8.numReplaced = 0;
  local_c8.numFailures = 0;
LAB_0023d42d:
  RVar4.numReplaced = local_c8.numReplaced;
  RVar4.numFailures = local_c8.numFailures;
  return RVar4;
}

Assistant:

RunStats run (bool ignoreTypeAndConstantErrors)
    {
        RunStats runStats;

        if (module.isFullyResolved)
            return runStats;

        if (module.isTemplateModule())
        {
            module.isFullyResolved = true;
            return runStats;
        }

        for (;;)
        {
            runStats.clear();

            tryPass<QualifiedIdentifierResolver> (runStats, true);
            tryPass<TypeResolver> (runStats, true);
            tryPass<ProcessorInstanceResolver> (runStats, true);
            tryPass<NamespaceAliasResolver> (runStats, true);
            tryPass<OperatorResolver> (runStats, true);
            rebuildVariableUseCounts (module);
            tryPass<FunctionResolver> (runStats, true);
            tryPass<ConstantFolder> (runStats, true);

            rebuildVariableUseCounts (module);

            if (runStats.numReplaced == 0)
                tryPass<GenericFunctionResolver> (runStats, true);

            // Can't use a range-based-for here because the array will change during the loop
            for (size_t i = 0; i < module.getSubModules().size(); ++i)
                runStats.add (ResolutionPass (allocator, module.getSubModules()[i])
                                .run (ignoreTypeAndConstantErrors));

            if (runStats.numFailures == 0)
                break;

            if (runStats.numReplaced == 0)
            {
                // failed to resolve anything new, so can't get any further..
                if (ignoreTypeAndConstantErrors)
                    return runStats;

                tryPass<FunctionResolver> (runStats, false);
                tryPass<QualifiedIdentifierResolver> (runStats, false);
                tryPass<TypeResolver> (runStats, false);
                tryPass<ProcessorInstanceResolver> (runStats, false);
                tryPass<NamespaceAliasResolver> (runStats, false);
                tryPass<OperatorResolver> (runStats, false);
                tryPass<GenericFunctionResolver> (runStats, false);
                break;
            }
        }

        SanityCheckPass::runPostResolutionChecks (module);

        module.isFullyResolved = true;
        return runStats;
    }